

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

bool __thiscall ClipperLib::Clipper::FixupIntersections(Clipper *this)

{
  TEdge *pTVar1;
  long64 lVar2;
  long64 lVar3;
  long64 lVar4;
  TEdge *pTVar5;
  IntersectNode *pIVar6;
  TEdge *e2;
  TEdge *edge2;
  bool bVar7;
  TEdge *e1;
  IntersectNode *pIVar8;
  
  bVar7 = true;
  if (this->m_IntersectNodes->next != (IntersectNode *)0x0) {
    pTVar5 = this->m_ActiveEdges;
    this->m_SortedEdges = pTVar5;
    if (pTVar5 != (TEdge *)0x0) {
      pTVar5->prevInSEL = (TEdge *)0x0;
      while (pTVar5 = pTVar5->nextInAEL, pTVar5 != (TEdge *)0x0) {
        pTVar5->prevInSEL = pTVar5->prevInAEL;
        pTVar5->prevInAEL->nextInSEL = pTVar5;
        pTVar5->nextInSEL = (TEdge *)0x0;
      }
    }
    pIVar8 = this->m_IntersectNodes;
    pIVar6 = pIVar8->next;
    do {
      if (pIVar6 == (IntersectNode *)0x0) {
        this->m_SortedEdges = (TEdge *)0x0;
        if (pIVar8->edge1->prevInSEL == pIVar8->edge2) {
          return true;
        }
        return pIVar8->edge1->nextInSEL == pIVar8->edge2;
      }
      pTVar5 = pIVar8->edge1;
      pTVar1 = pIVar8->edge2;
      edge2 = pTVar5->prevInSEL;
      if ((edge2 == pTVar1) || (edge2 = pTVar5->nextInSEL, edge2 == pTVar1)) {
LAB_0068731f:
        SwapPositionsInSEL(this,pTVar5,edge2);
        pIVar8 = pIVar8->next;
        pIVar6 = pIVar8->next;
        bVar7 = true;
      }
      else {
        do {
          if ((pIVar6->edge1->nextInSEL == pIVar6->edge2) ||
             (pIVar6->edge1->prevInSEL == pIVar6->edge2)) {
            lVar2 = (pIVar8->pt).X;
            lVar3 = (pIVar8->pt).Y;
            pIVar8->edge1 = pIVar6->edge1;
            pIVar8->edge2 = pIVar6->edge2;
            lVar4 = (pIVar6->pt).Y;
            (pIVar8->pt).X = (pIVar6->pt).X;
            (pIVar8->pt).Y = lVar4;
            pIVar6->edge1 = pTVar5;
            pIVar6->edge2 = pTVar1;
            (pIVar6->pt).X = lVar2;
            (pIVar6->pt).Y = lVar3;
            pTVar5 = pIVar8->edge1;
            edge2 = pIVar8->edge2;
            goto LAB_0068731f;
          }
          pIVar6 = pIVar6->next;
        } while (pIVar6 != (IntersectNode *)0x0);
        pIVar6 = (IntersectNode *)0x0;
        bVar7 = false;
      }
    } while (bVar7);
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool Clipper::FixupIntersections()
{
  if ( !m_IntersectNodes->next ) return true;

  CopyAELToSEL();
  IntersectNode *int1 = m_IntersectNodes;
  IntersectNode *int2 = m_IntersectNodes->next;
  while (int2)
  {
    TEdge *e1 = int1->edge1;
    TEdge *e2;
    if (e1->prevInSEL == int1->edge2) e2 = e1->prevInSEL;
    else if (e1->nextInSEL == int1->edge2) e2 = e1->nextInSEL;
    else
    {
      //The current intersection is out of order, so try and swap it with
      //a subsequent intersection ...
      while (int2)
      {
        if (int2->edge1->nextInSEL == int2->edge2 ||
          int2->edge1->prevInSEL == int2->edge2) break;
        else int2 = int2->next;
      }
      if ( !int2 ) return false; //oops!!!

      //found an intersect node that can be swapped ...
      SwapIntersectNodes(*int1, *int2);
      e1 = int1->edge1;
      e2 = int1->edge2;
    }
    SwapPositionsInSEL(e1, e2);
    int1 = int1->next;
    int2 = int1->next;
  }

  m_SortedEdges = 0;

  //finally, check the last intersection too ...
  return (int1->edge1->prevInSEL == int1->edge2 ||
    int1->edge1->nextInSEL == int1->edge2);
}